

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapass.cpp
# Opt level: O3

Error __thiscall asmjit::BaseRAPass::initGlobalLiveSpans(BaseRAPass *this)

{
  anon_union_8_2_185e79b9_for_Zone_4 *paVar1;
  float *pfVar2;
  uint *puVar3;
  ulong *puVar4;
  byte bVar5;
  size_type sVar6;
  size_type sVar7;
  Zone *pZVar8;
  PhysToWorkMap *pPVar9;
  BaseCompiler *this_00;
  ZoneVectorBase *pZVar10;
  Zone **ppZVar11;
  Error EVar12;
  int iVar13;
  anon_union_32_4_a21e1b61_for_String_0 *paVar14;
  ZoneAllocator *pZVar15;
  undefined4 extraout_var_00;
  ulong uVar16;
  undefined4 extraout_var_01;
  anon_union_32_4_a21e1b61_for_String_0 *paVar17;
  long *plVar18;
  long lVar19;
  undefined4 extraout_var_04;
  undefined8 extraout_RAX;
  uint uVar20;
  long lVar21;
  long lVar22;
  uint uVar23;
  uint uVar24;
  uint32_t size;
  Slot *pSVar25;
  undefined8 uVar26;
  anon_union_32_4_a21e1b61_for_String_0 *extraout_RDX;
  anon_union_32_4_a21e1b61_for_String_0 *paVar27;
  long extraout_RDX_00;
  uint uVar28;
  uint32_t uVar29;
  uint uVar30;
  anon_union_32_4_a21e1b61_for_String_0 *paVar31;
  anon_union_32_4_a21e1b61_for_String_0 *in_RSI;
  anon_union_32_4_a21e1b61_for_String_0 *paVar32;
  undefined8 uVar33;
  anon_union_32_4_a21e1b61_for_String_0 *paVar34;
  anon_union_32_4_a21e1b61_for_String_0 *paVar35;
  Zone *pZVar36;
  anon_union_32_4_a21e1b61_for_String_0 *paVar37;
  ulong uVar38;
  Zone *pZVar39;
  ZoneAllocator *x;
  size_t size_00;
  anon_union_32_4_a21e1b61_for_String_0 *unaff_R13;
  anon_union_32_4_a21e1b61_for_String_0 *paVar40;
  char *pcVar41;
  undefined8 *puVar42;
  char *pcVar43;
  undefined8 unaff_R15;
  anon_union_32_4_a21e1b61_for_String_0 *x_00;
  bool bVar44;
  float fVar45;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  float extraout_XMM0_Da_02;
  float fVar46;
  anon_union_32_4_a21e1b61_for_String_0 aStack_858;
  long lStack_838;
  Slot *apSStack_830 [4];
  long lStack_810;
  long lStack_808;
  long lStack_800;
  anon_union_32_4_a21e1b61_for_String_0 *paStack_7f8;
  long *plStack_7f0;
  long *plStack_7e8;
  BaseEmitHelper *pBStack_7e0;
  undefined8 uStack_7d8;
  anon_union_32_4_a21e1b61_for_String_0 *paStack_7c8;
  ZoneAllocator *pZStack_7c0;
  anon_union_32_4_a21e1b61_for_String_0 *paStack_7b8;
  anon_union_32_4_a21e1b61_for_String_0 *paStack_7b0;
  anon_union_32_4_a21e1b61_for_String_0 *paStack_7a8;
  anon_union_32_4_a21e1b61_for_String_0 *paStack_7a0;
  anon_union_32_4_a21e1b61_for_String_0 *paStack_790;
  anon_union_32_4_a21e1b61_for_String_0 aStack_788;
  ZoneAllocator *pZStack_768;
  Slot *apSStack_760 [4];
  anon_union_32_4_a21e1b61_for_String_0 *paStack_740;
  ZoneAllocator *pZStack_738;
  anon_union_32_4_a21e1b61_for_String_0 *paStack_730;
  char *pcStack_728;
  anon_union_32_4_a21e1b61_for_String_0 *paStack_720;
  anon_union_32_4_a21e1b61_for_String_0 *paStack_718;
  ZoneVectorBase ZStack_710;
  uint uStack_6fc;
  anon_union_32_4_a21e1b61_for_String_0 *paStack_6f8;
  ulong uStack_6f0;
  anon_union_32_4_a21e1b61_for_String_0 *paStack_6e8;
  RALiveSpans<asmjit::RALiveSpan<asmjit::LiveRegData>_> RStack_6e0;
  anon_union_32_4_a21e1b61_for_String_0 *paStack_6c8;
  ulong uStack_6c0;
  ulong uStack_6b8;
  anon_union_32_4_a21e1b61_for_String_0 *paStack_6b0;
  char *pcStack_6a8;
  anon_union_32_4_a21e1b61_for_String_0 aStack_6a0;
  anon_union_4_2_ebeb14a8_for_RARegCount_0 aaStack_680 [128];
  undefined8 auStack_480 [2];
  anon_union_4_2_ebeb14a8_for_RARegCount_0 aaStack_470 [2];
  undefined8 auStack_468 [128];
  BaseRAPass *pBStack_68;
  ZoneAllocator *pZStack_60;
  anon_union_32_4_a21e1b61_for_String_0 *paStack_58;
  ZoneAllocator *pZStack_50;
  undefined8 uStack_48;
  ulong uStack_40;
  size_t sStack_38;
  undefined4 extraout_var;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  
  pZVar15 = &this->_allocator;
  uVar26 = CONCAT71((int7)((ulong)unaff_R15 >> 8),1);
  uVar38 = 0;
  paVar17 = (anon_union_32_4_a21e1b61_for_String_0 *)this;
  do {
    x = (ZoneAllocator *)(ulong)this->_scratchRegIndexes[uVar38 - 8];
    if (x == (ZoneAllocator *)0x0) {
      unaff_R13 = (anon_union_32_4_a21e1b61_for_String_0 *)0x0;
    }
    else {
      if (pZVar15->_zone == (Zone *)0x0) {
        uStack_40 = 0x12036f;
        initGlobalLiveSpans();
        uStack_40 = uVar38;
        uStack_48 = uVar26;
        pZStack_50 = pZVar15;
        paStack_58 = unaff_R13;
        pZStack_60 = x;
        pBStack_68 = this;
        uVar38 = (ulong)in_RSI & 0xffffffff;
        pcVar41 = (char *)(uVar38 * 0x10);
        uVar28 = *(uint *)((long)paVar17 + uVar38 * 0x10 + 0x158);
        paVar31 = (anon_union_32_4_a21e1b61_for_String_0 *)(ulong)uVar28;
        if (uVar28 == 0) {
          return 0;
        }
        x_00 = (anon_union_32_4_a21e1b61_for_String_0 *)((long)paVar17 + 0x150);
        paVar40 = *(anon_union_32_4_a21e1b61_for_String_0 **)((long)paVar17 + 0x88);
        aStack_6a0._large.size = 0;
        aStack_6a0._0_8_ = 0x20;
        aStack_6a0._large.capacity = 0x207;
        aStack_6a0._large.data = (char *)aaStack_680;
        aaStack_680[0]._regs[0] = '\0';
        uStack_6f0 = uVar38;
        paStack_6e8 = paVar17;
        paStack_6c8 = paVar40;
        if (paVar40 == (anon_union_32_4_a21e1b61_for_String_0 *)0x0) {
          if (3 < (uint)in_RSI) goto LAB_00120b97;
        }
        else {
          pcVar43 = pcVar41;
          if (3 < (uint)in_RSI) goto LAB_00120b9c;
          paStack_718 = (anon_union_32_4_a21e1b61_for_String_0 *)0x120438;
          Logger::logf((Logger *)&paVar40->_small,0.0);
          paVar31 = (anon_union_32_4_a21e1b61_for_String_0 *)
                    (ulong)*(uint *)((long)paVar17 + uVar38 * 0x10 + 0x158);
        }
        uStack_6c0 = (ulong)*(byte *)((long)paStack_6e8 + uStack_6f0 + 0x10c);
        fVar45 = 0.0;
        ZStack_710._data = (anon_union_32_4_a21e1b61_for_String_0 *)0x0;
        ZStack_710._size = 0;
        ZStack_710._capacity = 0;
        RStack_6e0._data.super_ZoneVectorBase._data = (Zone *)0x0;
        RStack_6e0._data.super_ZoneVectorBase._size = 0;
        RStack_6e0._data.super_ZoneVectorBase._capacity = 0;
        pZVar15 = (ZoneAllocator *)((paStack_6e8->_small).data + 0x17);
        uVar29 = (uint32_t)paVar31;
        if (uVar29 == 0) {
          this = (BaseRAPass *)0x0;
        }
        else {
          paStack_718 = (anon_union_32_4_a21e1b61_for_String_0 *)0x12048d;
          EVar12 = ZoneVectorBase::_grow(&ZStack_710,pZVar15,8,uVar29);
          if (EVar12 != 0) goto LAB_00120b5b;
          x_00 = (anon_union_32_4_a21e1b61_for_String_0 *)((long)paVar17 + (long)(pcVar41 + 0x150));
          paStack_718 = (anon_union_32_4_a21e1b61_for_String_0 *)0x1204bb;
          memcpy((undefined1 *)
                 ((long)ZStack_710._data + ((ZStack_710._8_8_ & 0xffffffff) - 4) * 8 + 0x20),
                 (((ZoneVector<asmjit::RALiveSpan<asmjit::LiveRegData>_> *)&(x_00->_small).type)->
                 super_ZoneVectorBase)._data,(long)paVar31 << 3);
          this = (BaseRAPass *)(ulong)(uVar29 + ZStack_710._size);
          ZStack_710._size = uVar29 + ZStack_710._size;
          fVar45 = extraout_XMM0_Da;
        }
        in_RSI = (anon_union_32_4_a21e1b61_for_String_0 *)
                 ((long)ZStack_710._data + (long)((long)this + -4) * 8 + 0x20);
        paVar40 = (anon_union_32_4_a21e1b61_for_String_0 *)0x0;
        paVar34 = (anon_union_32_4_a21e1b61_for_String_0 *)ZStack_710._data;
        goto LAB_001204d9;
      }
      size_00 = (ulong)this->_scratchRegIndexes[uVar38 - 8] << 4;
      uStack_40 = 0x12031d;
      unaff_R13 = (anon_union_32_4_a21e1b61_for_String_0 *)
                  ZoneAllocator::_alloc(pZVar15,size_00,&sStack_38);
      if (unaff_R13 == (anon_union_32_4_a21e1b61_for_String_0 *)0x0) break;
      in_RSI = (anon_union_32_4_a21e1b61_for_String_0 *)0x0;
      uStack_40 = 0x120332;
      paVar17 = unaff_R13;
      memset(unaff_R13,0,size_00);
    }
    this->_globalLiveSpans[uVar38] = (LiveRegSpans *)unaff_R13;
    bVar44 = uVar38 < 3;
    uVar38 = uVar38 + 1;
    uVar26 = CONCAT71((int7)((ulong)uVar26 >> 8),bVar44);
  } while (uVar38 != 4);
  return (uint)uVar26 & 0xff;
LAB_001204d9:
  do {
    paVar32 = (anon_union_32_4_a21e1b61_for_String_0 *)((long)in_RSI - (long)paVar34);
    uVar38 = (long)paVar32 >> 3;
    paVar31 = (anon_union_32_4_a21e1b61_for_String_0 *)this;
    paVar17 = paStack_6e8;
    if (7 < uVar38) {
      paVar32 = (anon_union_32_4_a21e1b61_for_String_0 *)((long)in_RSI + -8);
      pZVar36 = *(Zone **)((long)paVar34 + (uVar38 & 0xfffffffffffffffe) * 4);
      *(Zone **)((long)paVar34 + (uVar38 & 0xfffffffffffffffe) * 4) =
           *(Zone **)&(paVar34->_small).type;
      *(Zone **)&(paVar34->_small).type = pZVar36;
      pZVar8 = *(Zone **)((paVar34->_small).data + 7);
      pZVar39 = *(Zone **)((long)in_RSI + -8);
      fVar46 = *(float *)&pZVar8[2].field_3;
      fVar45 = *(float *)&pZVar39[2].field_3;
      if (fVar46 < fVar45) {
        *(Zone **)((paVar34->_small).data + 7) = pZVar39;
        *(Zone **)paVar32 = pZVar8;
        pZVar36 = *(Zone **)&(paVar34->_small).type;
        pZVar39 = pZVar8;
        fVar45 = fVar46;
      }
      fVar46 = *(float *)&pZVar36[2].field_3;
      if (fVar46 < fVar45) {
        *(Zone **)&(paVar34->_small).type = pZVar39;
        *(Zone **)paVar32 = pZVar36;
        pZVar36 = *(Zone **)&(paVar34->_small).type;
        fVar46 = *(float *)&pZVar36[2].field_3;
      }
      paVar35 = (anon_union_32_4_a21e1b61_for_String_0 *)((paVar34->_small).data + 7);
      pZVar8 = *(Zone **)paVar35;
      paVar1 = &pZVar8[2].field_3;
      if (*(float *)paVar1 <= fVar46 && fVar46 != *(float *)paVar1) {
        *(Zone **)((paVar34->_small).data + 7) = pZVar36;
        *(Zone **)&(paVar34->_small).type = pZVar8;
      }
LAB_001205d3:
      if (paVar35 < paVar32) break;
      goto LAB_001205f0;
    }
    bVar44 = paVar34 != in_RSI;
    in_RSI = paVar32;
    if ((bVar44) && (1 < uVar38)) {
      in_RSI = (anon_union_32_4_a21e1b61_for_String_0 *)((long)paVar32 + (long)paVar34);
      paVar32 = (anon_union_32_4_a21e1b61_for_String_0 *)((paVar34->_small).data + 7);
      do {
        if (paVar34 < paVar32) {
          pZVar8 = *(Zone **)&(paVar32->_small).type;
          fVar45 = *(float *)&pZVar8[2].field_3;
          paVar35 = paVar32;
          do {
            pZVar39 = *(Zone **)((long)paVar35 + -8);
            paVar1 = &pZVar39[2].field_3;
            if (fVar45 < *(float *)paVar1 || fVar45 == *(float *)paVar1) break;
            *(Zone **)((long)paVar35 + -8) = pZVar8;
            *(Zone **)&(paVar35->_small).type = pZVar39;
            paVar35 = (anon_union_32_4_a21e1b61_for_String_0 *)((long)paVar35 + -8);
          } while (paVar34 < paVar35);
        }
        paVar32 = (anon_union_32_4_a21e1b61_for_String_0 *)((paVar32->_small).data + 7);
      } while (paVar32 < in_RSI);
    }
    if (paVar40 == (anon_union_32_4_a21e1b61_for_String_0 *)0x0) {
      uVar38 = uStack_6f0;
      if ((anon_union_32_4_a21e1b61_for_String_0 *)this ==
          (anon_union_32_4_a21e1b61_for_String_0 *)0x0) goto LAB_001208f5;
      uStack_6fc = *(uint *)((long)paStack_6e8 + uStack_6f0 * 4 + 0x118);
      paVar34 = (anon_union_32_4_a21e1b61_for_String_0 *)(ulong)uStack_6fc;
      x = (ZoneAllocator *)0x0;
      pcVar41 = (char *)0x0;
      paStack_6f8 = (anon_union_32_4_a21e1b61_for_String_0 *)this;
      paStack_6b0 = (anon_union_32_4_a21e1b61_for_String_0 *)pZVar15;
      goto LAB_00120691;
    }
    paVar34 = *(anon_union_32_4_a21e1b61_for_String_0 **)((long)auStack_480 + (long)paVar40);
    in_RSI = *(anon_union_32_4_a21e1b61_for_String_0 **)((long)(auStack_480 + 1) + (long)paVar40);
    paVar40 = (anon_union_32_4_a21e1b61_for_String_0 *)((long)paVar40 + -0x10);
  } while( true );
  pcVar43 = (paVar35->_small).data;
  paVar35 = (anon_union_32_4_a21e1b61_for_String_0 *)((paVar35->_small).data + 7);
  fVar45 = *(float *)(*(long *)(pcVar43 + 7) + 0x58);
  paVar1 = &(*(Zone **)&(paVar34->_small).type)[2].field_3;
  if (*(float *)paVar1 <= fVar45 && fVar45 != *(float *)paVar1) goto LAB_001205d3;
LAB_001205f0:
  do {
    if (paVar32 <= paVar34) break;
    pZVar10 = (ZoneVectorBase *)((long)paVar32 + -8);
    paVar32 = (anon_union_32_4_a21e1b61_for_String_0 *)((long)paVar32 + -8);
    fVar45 = *(float *)&(*(Zone **)&(paVar34->_small).type)[2].field_3;
    pfVar2 = (float *)((long)pZVar10->_data + 0x58);
  } while (*pfVar2 <= fVar45 && fVar45 != *pfVar2);
  if (paVar35 <= paVar32) {
    pZVar8 = *(Zone **)&(paVar35->_small).type;
    *(Zone **)&(paVar35->_small).type = *(Zone **)&(paVar32->_small).type;
    *(Zone **)&(paVar32->_small).type = pZVar8;
    goto LAB_001205d3;
  }
  pZVar8 = *(Zone **)&(paVar34->_small).type;
  *(Zone **)&(paVar34->_small).type = *(Zone **)&(paVar32->_small).type;
  *(Zone **)&(paVar32->_small).type = pZVar8;
  paVar14 = paVar34;
  paVar27 = paVar32;
  paVar37 = in_RSI;
  if ((long)in_RSI - (long)paVar35 < (long)paVar32 - (long)paVar34) {
    paVar14 = paVar35;
    paVar27 = in_RSI;
    paVar35 = paVar34;
    paVar37 = paVar32;
  }
  in_RSI = paVar27;
  *(anon_union_32_4_a21e1b61_for_String_0 **)((long)aaStack_470 + (long)paVar40) = paVar35;
  *(anon_union_32_4_a21e1b61_for_String_0 **)((long)auStack_468 + (long)paVar40) = paVar37;
  if (0x3f0 < (long)paVar40) goto LAB_00120b79;
  paVar40 = (anon_union_32_4_a21e1b61_for_String_0 *)((paVar40->_small).data + 0xf);
  paVar34 = paVar14;
  goto LAB_001204d9;
LAB_00120b79:
  paStack_718 = (anon_union_32_4_a21e1b61_for_String_0 *)0x120b7e;
  binPack();
  x = pZVar15;
LAB_00120b7e:
  paStack_718 = (anon_union_32_4_a21e1b61_for_String_0 *)0x120b83;
  binPack();
  pcVar43 = pcVar41;
LAB_00120b83:
  paStack_718 = (anon_union_32_4_a21e1b61_for_String_0 *)0x120b88;
  binPack();
LAB_00120b88:
  paStack_718 = (anon_union_32_4_a21e1b61_for_String_0 *)0x120b8d;
  binPack();
LAB_00120b8d:
  paStack_718 = (anon_union_32_4_a21e1b61_for_String_0 *)0x120b92;
  binPack();
LAB_00120b92:
  paStack_718 = (anon_union_32_4_a21e1b61_for_String_0 *)0x120b97;
  binPack();
  pcVar41 = pcVar43;
LAB_00120b97:
  paStack_718 = (anon_union_32_4_a21e1b61_for_String_0 *)0x120b9c;
  binPack();
  pcVar43 = pcVar41;
LAB_00120b9c:
  paStack_718 = (anon_union_32_4_a21e1b61_for_String_0 *)0x120ba1;
  binPack();
LAB_00120ba1:
  paStack_718 = (anon_union_32_4_a21e1b61_for_String_0 *)0x120ba6;
  binPack();
LAB_00120ba6:
  paStack_718 = (anon_union_32_4_a21e1b61_for_String_0 *)0x120bab;
  binPack();
  uVar28 = *(uint *)((long)in_RSI + 0xb8);
  paVar34 = (anon_union_32_4_a21e1b61_for_String_0 *)(ulong)uVar28;
  paStack_740 = (anon_union_32_4_a21e1b61_for_String_0 *)this;
  pZStack_738 = x;
  paStack_730 = unaff_R13;
  pcStack_728 = pcVar43;
  paStack_720 = x_00;
  paStack_718 = paVar31;
  if (paVar34 == (anon_union_32_4_a21e1b61_for_String_0 *)0xffffffff) {
    paVar34 = *(anon_union_32_4_a21e1b61_for_String_0 **)(&paVar40->_small + 1);
    paVar32 = *(anon_union_32_4_a21e1b61_for_String_0 **)((paVar17->_small).data + 0x17);
    uVar38 = *(long *)&(paVar32->_small).type + 3U & 0xfffffffffffffffc;
    if (*(ulong *)((paVar32->_small).data + 7) < uVar38) {
      uVar38 = *(ulong *)((paVar32->_small).data + 7);
    }
    *(int *)(uint8_t *)paVar32 = (int)uVar38;
    *(int *)((char *)((long)paVar32 + 1) + 3) = (int)(uVar38 >> 0x20);
    paStack_7a0 = (anon_union_32_4_a21e1b61_for_String_0 *)0x120c4d;
    iVar13 = Zone::dup((Zone *)&paVar32->_small,(int)paVar34);
    pZVar15 = (ZoneAllocator *)CONCAT44(extraout_var,iVar13);
    paVar35 = *(anon_union_32_4_a21e1b61_for_String_0 **)((paVar40->_small).data + 0x17);
    if (*(int *)((long)paVar17 + 0x148) != 0) {
      paVar32 = *(anon_union_32_4_a21e1b61_for_String_0 **)((paVar17->_small).data + 0x17);
      paStack_7a0 = (anon_union_32_4_a21e1b61_for_String_0 *)0x120c6d;
      paVar34 = paVar35;
      iVar13 = Zone::dup((Zone *)&paVar32->_small,(int)paVar35);
      paVar35 = (anon_union_32_4_a21e1b61_for_String_0 *)CONCAT44(extraout_var_00,iVar13);
    }
    if ((pZVar15 == (ZoneAllocator *)0x0) ||
       (paVar35 == (anon_union_32_4_a21e1b61_for_String_0 *)0x0)) {
      return 1;
    }
    *(ZoneAllocator **)((long)in_RSI + 200) = pZVar15;
    ((ZoneVectorBase *)((long)in_RSI + 0xd0))->_data = paVar35;
    if (in_RSI == extraout_RDX) {
      return (uint)(*(size_type *)((long)in_RSI + 0xb8) != 0xffffffff) * 3;
    }
    apSStack_760[2] = (Slot *)0x0;
    apSStack_760[3] = (Slot *)0x0;
    apSStack_760[0] = (Slot *)0x0;
    apSStack_760[1] = (Slot *)0x0;
    uVar28 = (uint)*(byte *)((long)paVar17 + 0x10d) + (uint)*(byte *)((long)paVar17 + 0x10c);
    x_00 = extraout_RDX;
    if (0xff < uVar28) goto LAB_00120eb1;
    uVar20 = *(byte *)((long)paVar17 + 0x10e) + uVar28;
    paVar34 = (anon_union_32_4_a21e1b61_for_String_0 *)(ulong)uVar20;
    x = pZVar15;
    if (0xff < uVar20) goto LAB_00120eb6;
    paVar32 = paVar17 + 10;
    aStack_788._0_4_ =
         uVar20 * 0x1000000 | uVar28 * 0x10000 | (uint)*(byte *)((long)paVar17 + 0x10c) << 8;
    aStack_788._4_4_ = *(undefined4 *)((long)paVar17 + 0x10c);
    aStack_788._large.size._0_4_ = ((uint)aStack_788._4_4_ >> 0x18) + uVar20;
    aStack_788._large.size._4_4_ = *(undefined4 *)((long)paVar17 + 0x148);
    lVar21 = 0;
    do {
      *(ulong *)((long)apSStack_760 + lVar21) =
           (long)pZVar15->_slots +
           (ulong)((uint)aStack_788._0_4_ >> ((byte)lVar21 & 0x1f) & 0xff) * 4 + 0x18;
      lVar21 = lVar21 + 8;
    } while (lVar21 != 0x20);
    paVar14 = *(anon_union_32_4_a21e1b61_for_String_0 **)((long)extraout_RDX + 0x88);
    x = *(ZoneAllocator **)((long)in_RSI + 0x78);
    iVar13 = *(int *)&(((ZoneVector<asmjit::RALiveSpan<asmjit::LiveRegData>_> *)
                       &((ZoneVectorBase *)((long)extraout_RDX + 0x90))->_data)->
                      super_ZoneVectorBase)._data;
    uVar28 = iVar13 + 0x3fU & 0xffffffc0;
    x_00 = (anon_union_32_4_a21e1b61_for_String_0 *)(ulong)uVar28;
    if (uVar28 == 0) {
      paVar27 = (anon_union_32_4_a21e1b61_for_String_0 *)0x0;
LAB_00120dc2:
      paVar40 = (anon_union_32_4_a21e1b61_for_String_0 *)0x0;
      paVar31 = paVar14;
    }
    else {
      ppZVar11 = &x->_zone;
      x = (ZoneAllocator *)x->_slots;
      paVar40 = (anon_union_32_4_a21e1b61_for_String_0 *)
                (~(ulong)*ppZVar11 &
                (ulong)(((ZoneVector<asmjit::RALiveSpan<asmjit::LiveRegData>_> *)
                        &(paVar14->_small).type)->super_ZoneVectorBase)._data);
      if (paVar40 == (anon_union_32_4_a21e1b61_for_String_0 *)0x0) {
        paVar14 = (anon_union_32_4_a21e1b61_for_String_0 *)((long)paVar14 + 8);
        paVar34 = (anon_union_32_4_a21e1b61_for_String_0 *)0x40;
        do {
          paVar27 = paVar34;
          paVar34 = paVar27;
          if (x_00 <= paVar27) goto LAB_00120dc2;
          ppZVar11 = &x->_zone;
          x = (ZoneAllocator *)x->_slots;
          paVar31 = (anon_union_32_4_a21e1b61_for_String_0 *)((paVar14->_small).data + 7);
          paVar34 = (anon_union_32_4_a21e1b61_for_String_0 *)(&paVar27->_small + 2);
          paVar40 = (anon_union_32_4_a21e1b61_for_String_0 *)
                    (~(ulong)*ppZVar11 &
                    (ulong)(((ZoneVector<asmjit::RALiveSpan<asmjit::LiveRegData>_> *)
                            &(paVar14->_small).type)->super_ZoneVectorBase)._data);
          paVar14 = paVar31;
        } while (paVar40 == (anon_union_32_4_a21e1b61_for_String_0 *)0x0);
      }
      else {
        paVar27 = (anon_union_32_4_a21e1b61_for_String_0 *)0x0;
        paVar31 = (anon_union_32_4_a21e1b61_for_String_0 *)((long)paVar14 + 8);
      }
    }
    paVar14 = paVar40;
    paStack_790 = paVar32;
    aStack_788._large.capacity = (size_t)paVar32;
    aStack_788._large.data = (char *)paVar35;
    pZStack_768 = pZVar15;
    if (iVar13 == *(int *)(in_RSI + 4)) {
      do {
        if (paVar14 == (anon_union_32_4_a21e1b61_for_String_0 *)0x0) {
          paStack_7a0 = (anon_union_32_4_a21e1b61_for_String_0 *)0x120e8f;
          blockEntryAssigned((BaseRAPass *)&paVar17->_small,(RAAssignment *)&aStack_788._small);
          return 0;
        }
        uVar38 = 0;
        if (paVar14 != (anon_union_32_4_a21e1b61_for_String_0 *)0x0) {
          for (; ((ulong)paVar14 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
          }
        }
        paVar34 = (anon_union_32_4_a21e1b61_for_String_0 *)(1L << ((byte)uVar38 & 0x3f));
        paVar40 = (anon_union_32_4_a21e1b61_for_String_0 *)((ulong)paVar14 ^ 1L << (uVar38 & 0x3f));
        in_RSI = paVar27;
        if ((paVar34 == paVar14) &&
           (in_RSI = (anon_union_32_4_a21e1b61_for_String_0 *)(&paVar27->_small + 2), in_RSI < x_00)
           ) {
          paVar34 = (anon_union_32_4_a21e1b61_for_String_0 *)((paVar31->_small).data + 7);
          pZVar15 = x;
          do {
            paVar31 = paVar34;
            x = (ZoneAllocator *)pZVar15->_slots;
            paVar40 = (anon_union_32_4_a21e1b61_for_String_0 *)
                      (~(ulong)pZVar15->_zone & (ulong)*(DynamicBlock **)((long)paVar31 + -8));
            paVar34 = paVar31;
            if (paVar40 != (anon_union_32_4_a21e1b61_for_String_0 *)0x0) goto LAB_00120e37;
            in_RSI = (anon_union_32_4_a21e1b61_for_String_0 *)(&in_RSI->_small + 2);
            paVar34 = (anon_union_32_4_a21e1b61_for_String_0 *)((paVar31->_small).data + 7);
            pZVar15 = x;
          } while (in_RSI < x_00);
          paVar40 = (anon_union_32_4_a21e1b61_for_String_0 *)0x0;
        }
LAB_00120e37:
        uVar28 = (uint)(undefined1 *)((long)paVar27 + uVar38);
        if (*(uint *)((long)paVar17 + 0x148) <= uVar28) {
          paStack_7a0 = (anon_union_32_4_a21e1b61_for_String_0 *)0x120ea7;
          setBlockEntryAssignment();
LAB_00120ea7:
          paStack_7a0 = (anon_union_32_4_a21e1b61_for_String_0 *)0x120eac;
          setBlockEntryAssignment();
          goto LAB_00120eac;
        }
        if ((uint)aStack_788._large.size._4_4_ <= uVar28) goto LAB_00120ea7;
        uVar38 = (long)paVar27 + uVar38 & 0xffffffff;
        paVar27 = in_RSI;
        paVar14 = paVar40;
        if ((byte)aStack_788._large.data[uVar38] != 0xff) {
          paVar32 = &aStack_788;
          paStack_7a0 = (anon_union_32_4_a21e1b61_for_String_0 *)0x120e7a;
          RAAssignment::unassign
                    ((RAAssignment *)&paVar32->_small,
                     *(uint *)(*(long *)(*(long *)paStack_790 + uVar38 * 8) + 0x20) >> 8 & 0xf,
                     uVar28,(uint)(byte)aStack_788._large.data[uVar38]);
        }
      } while( true );
    }
  }
  else {
    paVar32 = paVar17;
    if (uVar28 < *(uint *)((long)paVar17 + 0xf0)) {
      if (*(long *)(*(long *)((long)paVar17 + 0xe8) + 0x18 + (long)paVar34 * 0x28) != 0) {
        return 3;
      }
      EVar12 = setSharedAssignment((BaseRAPass *)&paVar17->_small,uVar28,
                                   (RAAssignment *)&paVar40->_small);
      return EVar12;
    }
LAB_00120eac:
    paStack_7a0 = (anon_union_32_4_a21e1b61_for_String_0 *)0x120eb1;
    setBlockEntryAssignment();
    pZVar15 = x;
LAB_00120eb1:
    paStack_7a0 = (anon_union_32_4_a21e1b61_for_String_0 *)0x120eb6;
    setBlockEntryAssignment();
    x = pZVar15;
LAB_00120eb6:
    paStack_7a0 = (anon_union_32_4_a21e1b61_for_String_0 *)0x120ebb;
    setBlockEntryAssignment();
  }
  paStack_7a0 = (anon_union_32_4_a21e1b61_for_String_0 *)setSharedAssignment;
  setBlockEntryAssignment();
  uVar28 = (uint)paVar34;
  paVar35 = paVar32;
  paStack_7c8 = paVar17;
  pZStack_7c0 = x;
  paStack_7b8 = paVar40;
  paStack_7b0 = in_RSI;
  paStack_7a8 = x_00;
  paStack_7a0 = paVar31;
  if (uVar28 < *(uint *)((long)paVar32 + 0xf0)) {
    uVar38 = (ulong)paVar34 & 0xffffffff;
    if (*(long *)(*(long *)((long)paVar32 + 0xe8) + 0x18 + uVar38 * 0x28) != 0) goto LAB_00121335;
    uVar26 = *(undefined8 *)(extraout_RDX_00 + 0x20);
    pZVar15 = (ZoneAllocator *)((paVar32->_small).data + 0x17);
    paVar35 = *(anon_union_32_4_a21e1b61_for_String_0 **)((paVar32->_small).data + 0x17);
    uVar16 = *(long *)&(paVar35->_small).type + 3U & 0xfffffffffffffffc;
    if (*(ulong *)((paVar35->_small).data + 7) < uVar16) {
      uVar16 = *(ulong *)((paVar35->_small).data + 7);
    }
    *(int *)(uint8_t *)paVar35 = (int)uVar16;
    *(int *)((char *)((long)paVar35 + 1) + 3) = (int)(uVar16 >> 0x20);
    iVar13 = Zone::dup((Zone *)&paVar35->_small,(int)uVar26);
    lVar21 = CONCAT44(extraout_var_01,iVar13);
    paVar17 = *(anon_union_32_4_a21e1b61_for_String_0 **)(extraout_RDX_00 + 0x18);
    if (*(int *)((long)paVar32 + 0x148) != 0) {
      paVar35 = (anon_union_32_4_a21e1b61_for_String_0 *)pZVar15->_zone;
      iVar13 = Zone::dup((Zone *)&paVar35->_small,(int)paVar17);
      paVar17 = (anon_union_32_4_a21e1b61_for_String_0 *)CONCAT44(extraout_var_02,iVar13);
    }
    if ((lVar21 == 0) || (paVar17 == (anon_union_32_4_a21e1b61_for_String_0 *)0x0)) {
      return 1;
    }
    paVar34 = paVar17;
    if (*(uint *)((long)paVar32 + 0xf0) <= uVar28) goto LAB_0012133a;
    lVar19 = *(long *)((long)paVar32 + 0xe8);
    lVar22 = lVar19 + uVar38 * 0x28;
    paVar35 = (anon_union_32_4_a21e1b61_for_String_0 *)(lVar22 + 8);
    *(long *)(lVar22 + 0x18) = lVar21;
    *(anon_union_32_4_a21e1b61_for_String_0 **)(lVar22 + 0x20) = paVar17;
    paVar34 = (anon_union_32_4_a21e1b61_for_String_0 *)pZVar15;
    paStack_7f8 = paVar17;
    EVar12 = ZoneBitVector::_resize
                       ((ZoneBitVector *)&paVar35->_small,pZVar15,
                        *(uint32_t *)((long)paVar32 + 0x148),*(uint32_t *)((long)paVar32 + 0x148),
                        false);
    if (EVar12 != 0) {
      return EVar12;
    }
    apSStack_830[2] = (Slot *)0x0;
    apSStack_830[3] = (Slot *)0x0;
    apSStack_830[0] = (Slot *)0x0;
    apSStack_830[1] = (Slot *)0x0;
    aStack_858._large.data = (char *)0x0;
    lStack_838 = 0;
    uVar20 = (uint)*(byte *)((long)paVar32 + 0x10d) + (uint)*(byte *)((long)paVar32 + 0x10c);
    if (uVar20 < 0x100) {
      uVar24 = *(byte *)((long)paVar32 + 0x10e) + uVar20;
      if (uVar24 < 0x100) {
        paVar34 = paVar32 + 10;
        aStack_858._0_4_ =
             uVar24 * 0x1000000 | uVar20 * 0x10000 | (uint)*(byte *)((long)paVar32 + 0x10c) << 8;
        aStack_858._4_4_ = *(undefined4 *)((long)paVar32 + 0x10c);
        aStack_858._large.size._0_4_ = ((uint)aStack_858._4_4_ >> 0x18) + uVar24;
        aStack_858._large.size._4_4_ = *(undefined4 *)((long)paVar32 + 0x148);
        pBStack_7e0 = (BaseEmitHelper *)0x0;
        uStack_7d8 = 0;
        aStack_858._large.capacity = (size_t)paVar34;
        if ((ulong)*(uint *)((long)paVar32 + 0xb8) != 0) {
          lStack_808 = lVar19 + uVar38 * 0x28;
          plVar18 = *(long **)((long)paVar32 + 0xb0);
          plStack_7f0 = plVar18 + *(uint *)((long)paVar32 + 0xb8);
          lStack_810 = lVar21;
          lStack_800 = extraout_RDX_00;
          do {
            lVar22 = lStack_800;
            lVar21 = *plVar18;
            plStack_7e8 = plVar18;
            if (*(uint *)(lVar21 + 0xb8) == uVar28) {
              if (*(long *)(lVar21 + 200) != 0) goto LAB_0012133f;
              uVar26 = *(undefined8 *)(lStack_800 + 0x20);
              paVar35 = *(anon_union_32_4_a21e1b61_for_String_0 **)((paVar32->_small).data + 0x17);
              uVar38 = *(long *)&(paVar35->_small).type + 3U & 0xfffffffffffffffc;
              if (*(ulong *)((paVar35->_small).data + 7) < uVar38) {
                uVar38 = *(ulong *)((paVar35->_small).data + 7);
              }
              *(int *)(uint8_t *)paVar35 = (int)uVar38;
              *(int *)((char *)((long)paVar35 + 1) + 3) = (int)(uVar38 >> 0x20);
              iVar13 = Zone::dup((Zone *)&paVar35->_small,(int)uVar26);
              lVar19 = CONCAT44(extraout_var_03,iVar13);
              pcVar41 = *(char **)(lVar22 + 0x18);
              if (*(int *)((long)paVar32 + 0x148) != 0) {
                paVar35 = (anon_union_32_4_a21e1b61_for_String_0 *)pZVar15->_zone;
                iVar13 = Zone::dup((Zone *)&paVar35->_small,(int)pcVar41);
                pcVar41 = (char *)CONCAT44(extraout_var_04,iVar13);
              }
              if (lVar19 == 0) {
                return 1;
              }
              if (pcVar41 == (char *)0x0) {
                return 1;
              }
              *(long *)(lVar21 + 200) = lVar19;
              *(char **)(lVar21 + 0xd0) = pcVar41;
              lVar22 = 0;
              do {
                paVar34 = (anon_union_32_4_a21e1b61_for_String_0 *)
                          (lVar19 + 0x20 +
                          (ulong)((uint)aStack_858._0_4_ >> ((byte)lVar22 & 0x1f) & 0xff) * 4);
                *(anon_union_32_4_a21e1b61_for_String_0 **)((long)apSStack_830 + lVar22) = paVar34;
                lVar22 = lVar22 + 8;
              } while (lVar22 != 0x20);
              lVar22 = *(long *)(lStack_808 + 8);
              uVar20 = *(uint *)(lStack_808 + 0x10);
              uVar24 = *(uint *)(lVar21 + 0x80);
              if (uVar20 <= *(uint *)(lVar21 + 0x80)) {
                uVar24 = uVar20;
              }
              if (0x3f < uVar24 + 0x3f) {
                paVar34 = *(anon_union_32_4_a21e1b61_for_String_0 **)(lVar21 + 0x78);
                paVar35 = (anon_union_32_4_a21e1b61_for_String_0 *)0x0;
                do {
                  puVar4 = (ulong *)(lVar22 + (long)paVar35 * 8);
                  *puVar4 = *puVar4 | *(ulong *)((long)paVar34 + (long)paVar35 * 8);
                  paVar35 = (anon_union_32_4_a21e1b61_for_String_0 *)((long)&paVar35->_small + 1);
                } while ((anon_union_32_4_a21e1b61_for_String_0 *)(ulong)(uVar24 + 0x3f >> 6) !=
                         paVar35);
              }
              if ((uVar20 & 0x3f) != 0) {
                paVar34 = (anon_union_32_4_a21e1b61_for_String_0 *)~(-1L << ((byte)uVar20 & 0x3f));
                puVar4 = (ulong *)(lVar22 + (ulong)(uVar20 >> 6) * 8);
                *puVar4 = *puVar4 & (ulong)paVar34;
              }
              uVar38 = 0;
              aStack_858._large.data = pcVar41;
              lStack_838 = lVar19;
              do {
                uVar20 = *(uint *)(lVar19 + uVar38 * 4);
                puVar3 = (uint *)((long)&pBStack_7e0 + uVar38 * 4);
                *puVar3 = *puVar3 | uVar20;
                if (uVar20 != 0) {
                  do {
                    uVar24 = 0;
                    if (uVar20 != 0) {
                      for (; (uVar20 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
                      }
                    }
                    uVar23 = *(uint *)((long)&apSStack_830[uVar38]->next + (ulong)uVar24 * 4);
                    if (*(uint *)(lVar21 + 0x80) <= uVar23) {
                      setSharedAssignment();
                      goto LAB_00121330;
                    }
                    if ((*(ulong *)(*(long *)(lVar21 + 0x78) + (ulong)(uVar23 >> 6) * 8) >>
                         ((ulong)uVar23 & 0x3f) & 1) == 0) {
                      paVar34 = (anon_union_32_4_a21e1b61_for_String_0 *)(uVar38 & 0xffffffff);
                      paVar35 = &aStack_858;
                      RAAssignment::unassign
                                ((RAAssignment *)&aStack_858._small,(uint32_t)uVar38,uVar23,uVar24);
                    }
                    bVar44 = 1 << ((byte)uVar24 & 0x1f) != uVar20;
                    uVar20 = uVar20 ^ 1 << (uVar24 & 0x1f);
                  } while (bVar44);
                }
                uVar38 = uVar38 + 1;
              } while (uVar38 != 4);
            }
            plVar18 = plStack_7e8 + 1;
            lVar21 = lStack_810;
          } while (plVar18 != plStack_7f0);
        }
        aStack_858._large.data = (char *)paStack_7f8;
        lVar22 = 0;
        do {
          *(ulong *)((long)apSStack_830 + lVar22) =
               lVar21 + 0x20 + (ulong)((uint)aStack_858._0_4_ >> ((byte)lVar22 & 0x1f) & 0xff) * 4;
          lVar22 = lVar22 + 8;
        } while (lVar22 != 0x20);
        lVar22 = 0;
        lStack_838 = lVar21;
        do {
          uVar28 = ~*(uint *)((long)&pBStack_7e0 + lVar22 * 4) &
                   *(uint *)((long)paVar32 + lVar22 * 4 + 0x118);
          if (uVar28 != 0) {
            do {
              uVar20 = 0;
              if (uVar28 != 0) {
                for (; (uVar28 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
                }
              }
              if ((*(uint *)(lStack_838 + lVar22 * 4) >> (uVar20 & 0x1f) & 1) != 0) {
                RAAssignment::unassign
                          ((RAAssignment *)&aStack_858._small,(uint32_t)lVar22,
                           *(uint32_t *)((long)&apSStack_830[lVar22]->next + (ulong)uVar20 * 4),
                           uVar20);
              }
              bVar44 = 1 << ((byte)uVar20 & 0x1f) != uVar28;
              uVar28 = uVar28 ^ 1 << (uVar20 & 0x1f);
            } while (bVar44);
          }
          lVar22 = lVar22 + 1;
        } while (lVar22 != 4);
        blockEntryAssigned((BaseRAPass *)&paVar32->_small,(RAAssignment *)&aStack_858._small);
        return 0;
      }
      goto LAB_00121349;
    }
  }
  else {
LAB_00121330:
    setSharedAssignment();
LAB_00121335:
    setSharedAssignment();
LAB_0012133a:
    setSharedAssignment();
LAB_0012133f:
    setSharedAssignment();
  }
  setSharedAssignment();
LAB_00121349:
  setSharedAssignment();
  lVar21 = *(long *)(&paVar34->_small + 1);
  uVar28 = *(uint *)((long)paVar35 + 0x148);
  lVar22 = 0;
  do {
    if ((*(char *)((long)paVar35 + lVar22 + 400) != '\0') &&
       (uVar20 = *(uint *)(lVar21 + lVar22 * 4), uVar20 != 0)) {
      lVar19 = *(long *)((long)paVar34 + (lVar22 + 1) * 8 + 0x20);
      pPVar9 = *(PhysToWorkMap **)(paVar35 + 10);
      do {
        uVar24 = 0;
        if (uVar20 != 0) {
          for (; (uVar20 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
          }
        }
        uVar23 = *(uint *)(lVar19 + (ulong)uVar24 * 4);
        if (uVar28 <= uVar23) {
          blockEntryAssigned();
          if (uVar24 < 0x41) {
            if (*(uint *)((long)paVar35 + 0x1c8) == 0) {
              EVar12 = BaseCompiler::_newStack
                                 (*(BaseCompiler **)((paVar35->_small).data + 7),
                                  (BaseMem *)((long)paVar35 + 0x1c8),size,uVar24,(char *)0x0);
              if (EVar12 != 0) {
                return EVar12;
              }
LAB_0012141f:
              pPVar9 = *(PhysToWorkMap **)((long)paVar35 + 0x1d0);
              (((ZoneVector<asmjit::RALiveSpan<asmjit::LiveRegData>_> *)&(paVar34->_small).type)->
              super_ZoneVectorBase)._data = *(WorkToPhysMap **)((long)paVar35 + 0x1c8);
              *(PhysToWorkMap **)((paVar34->_small).data + 7) = pPVar9;
              return 0;
            }
            if ((*(uint *)((long)paVar35 + 0x1c8) >> 0xd & 1) != 0) {
              this_00 = *(BaseCompiler **)((paVar35->_small).data + 7);
              uVar28 = *(uint32_t *)((long)paVar35 + 0x1cc) - 0x100;
              if (uVar28 < (this_00->_vRegArray).super_ZoneVectorBase._size) {
                lVar21 = *(long *)((long)(this_00->_vRegArray).super_ZoneVectorBase._data +
                                  (ulong)uVar28 * 8);
                uVar28 = *(uint *)(lVar21 + 8);
                uVar29 = size;
                if (size < uVar28) {
                  uVar29 = uVar28;
                }
                uVar28 = (uint)*(byte *)(lVar21 + 0xc);
                if (uVar24 < uVar28) {
                  uVar24 = uVar28;
                }
                BaseCompiler::setStackSize
                          (this_00,*(uint32_t *)((long)paVar35 + 0x1cc),uVar29,uVar24);
                goto LAB_0012141f;
              }
              goto LAB_0012144f;
            }
          }
          else {
            useTemporaryMem();
          }
          useTemporaryMem();
LAB_0012144f:
          useTemporaryMem();
          __clang_call_terminate(extraout_RAX);
        }
        uVar30 = 1 << ((byte)uVar24 & 0x1f);
        puVar3 = (uint *)(*(long *)((pPVar9->assigned)._masks + (ulong)uVar23 * 2) + 0x28);
        *puVar3 = *puVar3 | uVar30;
        bVar44 = uVar30 != uVar20;
        uVar20 = uVar20 ^ 1 << (uVar24 & 0x1f);
      } while (bVar44);
    }
    lVar22 = lVar22 + 1;
    if (lVar22 == 4) {
      return 0;
    }
  } while( true );
LAB_00120691:
  do {
    if ((ZoneAllocator *)(ZStack_710._8_8_ & 0xffffffff) <= x) goto LAB_00120b7e;
    unaff_R13 = *(anon_union_32_4_a21e1b61_for_String_0 **)
                 ((long)ZStack_710._data + (long)((long)&x[-1]._dynamicBlocks + 4) * 8 + 0x20);
    bVar5 = *(undefined1 *)((long)unaff_R13 + 0x3b);
    paVar31 = (anon_union_32_4_a21e1b61_for_String_0 *)(ulong)bVar5;
    paVar40 = (anon_union_32_4_a21e1b61_for_String_0 *)ZStack_710._data;
    pcVar43 = pcVar41;
    if ((bVar5 == 0xff) || (((uint)paVar34 >> (bVar5 & 0x1f) & 1) == 0)) {
LAB_00120767:
      if (ZStack_710._size <= (uint)pcVar41) goto LAB_00120b83;
      pcVar43 = (char *)(ulong)((uint)pcVar41 + 1);
      *(anon_union_32_4_a21e1b61_for_String_0 **)
       ((long)ZStack_710._data + (long)(pcVar41 + -4) * 8 + 0x20) = unaff_R13;
      paVar40 = (anon_union_32_4_a21e1b61_for_String_0 *)ZStack_710._data;
    }
    else {
      x_00 = (anon_union_32_4_a21e1b61_for_String_0 *)
             (*(long *)((long)paVar17 + uVar38 * 8 + 0x1a8) + (ulong)bVar5 * 0x10);
      paVar40 = unaff_R13 + 2;
      aaStack_470[0] = *(anon_union_4_2_ebeb14a8_for_RARegCount_0 *)((unaff_R13->_small).data + 3);
      paStack_718 = (anon_union_32_4_a21e1b61_for_String_0 *)0x1206f8;
      in_RSI = paStack_6b0;
      EVar12 = RALiveSpans<asmjit::RALiveSpan<asmjit::LiveRegData>_>::nonOverlappingUnionOf
                         (&RStack_6e0,(ZoneAllocator *)&paStack_6b0->_small,
                          (RALiveSpans<asmjit::RALiveSpan<asmjit::LiveRegData>_> *)&x_00->_small,
                          (RALiveSpans<asmjit::RALiveSpan<asmjit::LiveRegData>_> *)&paVar40->_small,
                          (DataType *)aaStack_470);
      this = (BaseRAPass *)paStack_6f8;
      paVar17 = paStack_6e8;
      uVar38 = uStack_6f0;
      fVar45 = extraout_XMM0_Da_00;
      if (EVar12 != 0) {
        if (EVar12 == 0xffffffff) {
          paVar34 = (anon_union_32_4_a21e1b61_for_String_0 *)(ulong)uStack_6fc;
          goto LAB_00120767;
        }
        goto LAB_00120b5b;
      }
      *(byte *)((long)unaff_R13 + 0x3a) = bVar5;
      pZVar8 = *(Zone **)&(x_00->_small).type;
      *(void **)&(x_00->_small).type = RStack_6e0._data.super_ZoneVectorBase._data;
      sVar6 = *(size_type *)((x_00->_small).data + 7);
      *(size_type *)((x_00->_small).data + 7) = RStack_6e0._data.super_ZoneVectorBase._size;
      sVar7 = *(size_type *)((x_00->_small).data + 0xb);
      paVar40 = (anon_union_32_4_a21e1b61_for_String_0 *)
                (ulong)RStack_6e0._data.super_ZoneVectorBase._capacity;
      *(size_type *)((x_00->_small).data + 0xb) = RStack_6e0._data.super_ZoneVectorBase._capacity;
      RStack_6e0._data.super_ZoneVectorBase._capacity = sVar7;
      RStack_6e0._data.super_ZoneVectorBase._size = sVar6;
      paVar34 = (anon_union_32_4_a21e1b61_for_String_0 *)(ulong)uStack_6fc;
      RStack_6e0._data.super_ZoneVectorBase._data = pZVar8;
    }
    x = (ZoneAllocator *)((long)&x->_zone + 1);
    pcVar41 = pcVar43;
  } while (this != (BaseRAPass *)x);
  uVar28 = (uint)pcVar43;
  if (ZStack_710._capacity < uVar28) goto LAB_00120ba1;
  ZStack_710._size = uVar28;
  if (uVar28 == 0) {
LAB_001208f5:
    paVar40 = (anon_union_32_4_a21e1b61_for_String_0 *)0x0;
LAB_001208f8:
    paVar31 = paVar40;
    if (paStack_6c8 == (anon_union_32_4_a21e1b61_for_String_0 *)0x0) {
      if ((int)paVar40 != 0) goto LAB_00120a49;
    }
    else {
      if (uStack_6c0 != 0) {
        paStack_6f8 = (anon_union_32_4_a21e1b61_for_String_0 *)
                      CONCAT44(paStack_6f8._4_4_,(int)paVar40);
        uVar16 = 0;
        do {
          lVar21 = *(long *)((long)paVar17 + uVar38 * 8 + 0x1a8);
          if (*(int *)(lVar21 + uVar16 * 0x10 + 8) != 0) {
            puVar42 = (undefined8 *)(lVar21 + uVar16 * 0x10);
            paStack_718 = (anon_union_32_4_a21e1b61_for_String_0 *)0x120945;
            String::clear((String *)&aStack_6a0._small);
            paStack_718 = (anon_union_32_4_a21e1b61_for_String_0 *)0x12095d;
            String::_opFormat((String *)&aStack_6a0._small,1,"  %02u: ",uVar16 & 0xffffffff);
            if (*(int *)(puVar42 + 1) != 0) {
              lVar21 = 8;
              uVar38 = 0;
              do {
                unaff_R13 = (anon_union_32_4_a21e1b61_for_String_0 *)*puVar42;
                if (uVar38 != 0) {
                  paStack_718 = (anon_union_32_4_a21e1b61_for_String_0 *)0x12098f;
                  String::_opString((String *)&aStack_6a0._small,1,", ",0xffffffffffffffff);
                }
                paStack_718 = (anon_union_32_4_a21e1b61_for_String_0 *)0x1209b4;
                String::_opFormat((String *)&aStack_6a0._small,1,"[%u:%u@%u]",
                                  (ulong)*(uint *)((long)unaff_R13 + lVar21 + -8),
                                  (ulong)*(uint *)((long)unaff_R13 + lVar21 + -4),
                                  (ulong)*(uint *)((long)&(unaff_R13->_small).type + lVar21));
                uVar38 = uVar38 + 1;
                lVar21 = lVar21 + 0xc;
              } while (uVar38 < *(uint *)(puVar42 + 1));
            }
            paStack_718 = (anon_union_32_4_a21e1b61_for_String_0 *)0x1209d6;
            String::_opChar((String *)&aStack_6a0._small,1,'\n');
            uVar26 = aStack_6a0._0_8_ & 0xff;
            uVar33 = aStack_6a0._small.data;
            if (0x1e < (aStack_6a0._0_8_ & 0xff)) {
              uVar26 = aStack_6a0._large.size;
              uVar33 = aStack_6a0._large.data;
            }
            paStack_718 = (anon_union_32_4_a21e1b61_for_String_0 *)0x1209fe;
            (*(code *)(*(Zone **)&(paStack_6c8->_small).type)->_block)(paStack_6c8,uVar33,uVar26);
            paVar17 = paStack_6e8;
            uVar38 = uStack_6f0;
            fVar45 = extraout_XMM0_Da_02;
          }
          uVar16 = uVar16 + 1;
        } while (uVar16 != uStack_6c0);
        paVar40 = (anon_union_32_4_a21e1b61_for_String_0 *)(ZStack_710._8_8_ & 0xffffffff);
        paVar31 = (anon_union_32_4_a21e1b61_for_String_0 *)((ulong)paStack_6f8 & 0xffffffff);
      }
      if ((int)paVar40 == 0) {
        EVar12 = 0;
        paStack_718 = (anon_union_32_4_a21e1b61_for_String_0 *)0x120a38;
        Logger::logf((Logger *)&paStack_6c8->_small,fVar45);
        goto LAB_00120b5b;
      }
LAB_00120a49:
      *(undefined1 *)((long)paVar17 + uVar38 + 400) = 1;
      lVar21 = 0;
      do {
        puVar3 = (uint *)(*(long *)((long)ZStack_710._data + lVar21) + 0x24);
        *puVar3 = *puVar3 | 4;
        lVar21 = lVar21 + 8;
      } while ((long)paVar40 << 3 != lVar21);
      if (paStack_6c8 != (anon_union_32_4_a21e1b61_for_String_0 *)0x0) {
        paVar17 = &aStack_6a0;
        paStack_718 = (anon_union_32_4_a21e1b61_for_String_0 *)0x120a8b;
        String::clear((String *)&paVar17->_small);
        in_RSI = (anon_union_32_4_a21e1b61_for_String_0 *)0x1;
        paStack_718 = (anon_union_32_4_a21e1b61_for_String_0 *)0x120aa3;
        String::_opFormat((String *)&paVar17->_small,1,"  Unassigned (%u): ");
        if ((int)paVar31 != 0) {
          x = (ZoneAllocator *)0x0;
          this = (BaseRAPass *)&aStack_6a0;
          pcVar43 = ", ";
          do {
            x_00 = paVar31;
            if ((ZoneAllocator *)(ZStack_710._8_8_ & 0xffffffff) <= x) goto LAB_00120b8d;
            unaff_R13 = *(anon_union_32_4_a21e1b61_for_String_0 **)
                         ((long)ZStack_710._data +
                         (long)((long)&x[-1]._dynamicBlocks + 4) * 8 + 0x20);
            if (x != (ZoneAllocator *)0x0) {
              paStack_718 = (anon_union_32_4_a21e1b61_for_String_0 *)0x120aea;
              String::_opString((String *)this,1,", ",0xffffffffffffffff);
            }
            pSVar25 = *(Slot **)((long)unaff_R13 + 8);
            if (*(uint *)&pSVar25[2].next < 0xc) {
              pSVar25 = (Slot *)((long)&pSVar25[2].next + 4);
            }
            else {
              pSVar25 = pSVar25[3].next;
            }
            in_RSI = (anon_union_32_4_a21e1b61_for_String_0 *)0x1;
            paVar40 = (anon_union_32_4_a21e1b61_for_String_0 *)0xffffffffffffffff;
            paStack_718 = (anon_union_32_4_a21e1b61_for_String_0 *)0x120b12;
            paVar17 = (anon_union_32_4_a21e1b61_for_String_0 *)this;
            String::_opString((String *)this,1,(char *)pSVar25,0xffffffffffffffff);
            x = (ZoneAllocator *)((long)&x->_zone + 1);
          } while (paVar31 != (anon_union_32_4_a21e1b61_for_String_0 *)x);
        }
        paStack_718 = (anon_union_32_4_a21e1b61_for_String_0 *)0x120b31;
        String::_opChar((String *)&aStack_6a0._small,1,'\n');
        uVar26 = aStack_6a0._large.size;
        uVar33 = aStack_6a0._large.data;
        if ((aStack_6a0._0_8_ & 0xff) < 0x1f) {
          uVar26 = aStack_6a0._0_8_ & 0xff;
          uVar33 = aStack_6a0._small.data;
        }
        paStack_718 = (anon_union_32_4_a21e1b61_for_String_0 *)0x120b59;
        (*(code *)(*(Zone **)&(paStack_6c8->_small).type)->_block)(paStack_6c8,uVar33,uVar26);
      }
    }
    EVar12 = 0;
LAB_00120b5b:
    paStack_718 = (anon_union_32_4_a21e1b61_for_String_0 *)0x120b65;
    String::reset((String *)&aStack_6a0._small);
    return EVar12;
  }
  uVar16 = 0;
  paVar32 = (anon_union_32_4_a21e1b61_for_String_0 *)0x0;
  pcStack_6a8 = pcVar43;
  do {
    if ((ZStack_710._8_8_ & 0xffffffff) <= uVar16) goto LAB_00120b88;
    pcVar43 = *(char **)((long)ZStack_710._data + (uVar16 - 4) * 8 + 0x20);
    paVar40 = (anon_union_32_4_a21e1b61_for_String_0 *)ZStack_710._data;
    if ((int)paVar34 != 0) {
      paStack_6f8 = (anon_union_32_4_a21e1b61_for_String_0 *)
                    CONCAT44(paStack_6f8._4_4_,(int)paVar32);
      paVar40 = (anon_union_32_4_a21e1b61_for_String_0 *)(pcVar43 + 0x40);
      paVar31 = paVar34;
      uStack_6b8 = uVar16;
      do {
        uVar28 = 0;
        uVar20 = (uint)paVar31;
        if (uVar20 != 0) {
          for (; (uVar20 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
          }
        }
        uVar23 = *(uint *)(pcVar43 + 0x2c) & uVar20;
        uVar24 = 0;
        if (uVar23 != 0) {
          for (; (uVar23 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
          }
        }
        if (uVar23 == 0) {
          uVar24 = uVar28;
        }
        x_00 = (anon_union_32_4_a21e1b61_for_String_0 *)(ulong)uVar24;
        x = (ZoneAllocator *)(*(long *)((long)paVar17 + uVar38 * 8 + 0x1a8) + (ulong)(uVar24 << 4));
        aaStack_470[0] = *(anon_union_4_2_ebeb14a8_for_RARegCount_0 *)(pcVar43 + 4);
        paStack_718 = (anon_union_32_4_a21e1b61_for_String_0 *)0x120826;
        in_RSI = paStack_6b0;
        EVar12 = RALiveSpans<asmjit::RALiveSpan<asmjit::LiveRegData>_>::nonOverlappingUnionOf
                           (&RStack_6e0,(ZoneAllocator *)&paStack_6b0->_small,
                            (RALiveSpans<asmjit::RALiveSpan<asmjit::LiveRegData>_> *)x,
                            (RALiveSpans<asmjit::RALiveSpan<asmjit::LiveRegData>_> *)
                            &paVar40->_small,(DataType *)aaStack_470);
        paVar17 = paStack_6e8;
        uVar16 = uStack_6b8;
        uVar38 = uStack_6f0;
        unaff_R13 = paVar40;
        fVar45 = extraout_XMM0_Da_01;
        if (EVar12 == 0) {
          pcVar43[0x3a] = (byte)uVar24;
          pZVar8 = x->_zone;
          x->_zone = (Zone *)RStack_6e0._data.super_ZoneVectorBase._data;
          sVar6 = *(size_type *)x->_slots;
          *(size_type *)x->_slots = RStack_6e0._data.super_ZoneVectorBase._size;
          sVar7 = *(size_type *)((long)x->_slots + 4);
          paVar40 = (anon_union_32_4_a21e1b61_for_String_0 *)
                    (ulong)RStack_6e0._data.super_ZoneVectorBase._capacity;
          *(size_type *)((long)x->_slots + 4) = RStack_6e0._data.super_ZoneVectorBase._capacity;
          RStack_6e0._data.super_ZoneVectorBase._capacity = sVar7;
          RStack_6e0._data.super_ZoneVectorBase._size = sVar6;
          paVar34 = (anon_union_32_4_a21e1b61_for_String_0 *)(ulong)uStack_6fc;
          uVar28 = (uint)paStack_6f8;
          RStack_6e0._data.super_ZoneVectorBase._data = pZVar8;
          goto LAB_001208d5;
        }
        this = (BaseRAPass *)(ulong)EVar12;
        if (EVar12 != 0xffffffff) goto LAB_00120b5b;
        paVar31 = (anon_union_32_4_a21e1b61_for_String_0 *)(ulong)(uVar20 ^ 1 << (uVar24 & 0x1f));
      } while (1 << ((byte)uVar24 & 0x1f) != uVar20);
      paVar32 = (anon_union_32_4_a21e1b61_for_String_0 *)((ulong)paStack_6f8 & 0xffffffff);
      paVar34 = (anon_union_32_4_a21e1b61_for_String_0 *)(ulong)uStack_6fc;
    }
    if (ZStack_710._size <= (uint)paVar32) goto LAB_00120b92;
    *(char **)((long)ZStack_710._data + (long)((long)paVar32 + -4) * 8 + 0x20) = pcVar43;
    paVar40 = (anon_union_32_4_a21e1b61_for_String_0 *)ZStack_710._data;
    uVar28 = (uint)paVar32 + 1;
LAB_001208d5:
    paVar32 = (anon_union_32_4_a21e1b61_for_String_0 *)(ulong)uVar28;
    uVar16 = uVar16 + 1;
  } while ((char *)uVar16 != pcStack_6a8);
  if (uVar28 <= ZStack_710._capacity) {
    ZStack_710._size = uVar28;
    paVar40 = paVar32;
    goto LAB_001208f8;
  }
  goto LAB_00120ba6;
}

Assistant:

ASMJIT_FAVOR_SPEED Error BaseRAPass::initGlobalLiveSpans() noexcept {
  for (uint32_t group = 0; group < BaseReg::kGroupVirt; group++) {
    size_t physCount = _physRegCount[group];
    LiveRegSpans* liveSpans = nullptr;

    if (physCount) {
      liveSpans = allocator()->allocT<LiveRegSpans>(physCount * sizeof(LiveRegSpans));
      if (ASMJIT_UNLIKELY(!liveSpans))
        return DebugUtils::errored(kErrorOutOfMemory);

      for (size_t physId = 0; physId < physCount; physId++)
        new(&liveSpans[physId]) LiveRegSpans();
    }

    _globalLiveSpans[group] = liveSpans;
  }

  return kErrorOk;
}